

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStructTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::UniformStructTests::init(UniformStructTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  deBool dVar2;
  LineStream *pLVar3;
  ShaderStructCase *pSVar4;
  LineStream local_3760;
  LineStream local_35c0;
  LineStream local_3420;
  LineStream local_3280;
  LineStream local_30e0;
  LineStream local_2f40;
  LineStream local_2da0;
  LineStream local_2c00;
  LineStream local_2a60;
  LineStream local_28c0;
  LineStream local_2720;
  LineStream local_2580;
  LineStream local_23e0;
  LineStream local_2240;
  LineStream local_20a0;
  LineStream local_1f00;
  LineStream local_1d60;
  LineStream local_1bc0;
  LineStream local_1a20;
  LineStream local_1880;
  LineStream local_16e0;
  LineStream local_1540;
  LineStream local_13a0;
  LineStream local_1200;
  LineStream local_1060;
  LineStream local_ec0;
  LineStream local_d20;
  LineStream local_b80;
  LineStream local_9e0;
  LineStream local_840;
  LineStream local_6a0;
  LineStream local_500;
  LineStream local_360;
  LineStream local_1b0;
  UniformStructTests *local_10;
  UniformStructTests *this_local;
  
  local_10 = this;
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_1b0,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_1b0,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.x, s.b.y, s.c);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"basic_vertex","Basic struct usage",true,0,
                              init()::Eval_basic::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_basic::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_1b0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_360,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_360,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.x, s.b.y, s.c);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"basic_fragment","Basic struct usage",false,0,
                              init()::Eval_basic::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_basic::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_360);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_500,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_500,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.b, s.b.a + s.c);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"nested_vertex","Nested struct",true,0,
                              init()::Eval_nested::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_nested::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_500);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_6a0,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_6a0,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b.b, s.b.a + s.c);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"nested_fragment","Nested struct",false,0,
                              init()::Eval_nested::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_nested::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_6a0);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_840,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_840,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\tb[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b[0], s.b[1], s.c);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"array_member_vertex","Struct with array member",true,0,
                              init()::Eval_array_member::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_array_member::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_840);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_9e0,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_9e0,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\tb[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(s.a, s.b[0], s.b[1], s.c);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"array_member_fragment","Struct with array member",false,0,
                              init()::Eval_array_member::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_array_member::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_9e0);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_b80,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_b80,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\tb[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\t${DST} = vec4(s.b[ui_one], s.b[ui_zero], s.b[ui_two], s.c);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"array_member_dynamic_index_vertex",
                              "Struct with array member, dynamic indexing",true,4,
                              init()::Eval_array_member_dynamic_index::eval(deqp::gls::
                              ShaderEvalContext__,
                              init()::SetUniforms_array_member_dynamic_index::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_b80);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_d20,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_d20,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\tb[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\t${DST} = vec4(s.b[ui_one], s.b[ui_zero], s.b[ui_two], s.c);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"array_member_dynamic_index_fragment",
                              "Struct with array member, dynamic indexing",false,4,
                              init()::Eval_array_member_dynamic_index::eval(deqp::gls::
                              ShaderEvalContext__,
                              init()::SetUniforms_array_member_dynamic_index::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_d20);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_ec0,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_ec0,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump int\t\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\t${DST} = vec4(s[2].a, s[1].a, s[0].a, s[2].b - s[1].b + s[0].b);")
    ;
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"struct_array_vertex","Struct array",true,0,
                              init()::Eval_struct_array::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_struct_array::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_ec0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_1060,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_1060,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump int\t\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\t${DST} = vec4(s[2].a, s[1].a, s[0].a, s[2].b - s[1].b + s[0].b);")
    ;
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"struct_array_fragment","Struct array",false,0,
                              init()::Eval_struct_array::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_struct_array::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_1060);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_1200,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_1200,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump int\t\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\t${DST} = vec4(s[ui_two].a, s[ui_one].a, s[ui_zero].a, s[ui_two].b - s[ui_one].b + s[ui_zero].b);"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"struct_array_dynamic_index_vertex",
                              "Struct array with dynamic indexing",true,4,
                              init()::Eval_struct_array_dynamic_index::eval(deqp::gls::
                              ShaderEvalContext__,
                              init()::SetUniforms_struct_array_dynamic_index::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_1200);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_13a0,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_13a0,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump int\t\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\t${DST} = vec4(s[ui_two].a, s[ui_one].a, s[ui_zero].a, s[ui_two].b - s[ui_one].b + s[ui_zero].b);"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"struct_array_dynamic_index_fragment",
                              "Struct array with dynamic indexing",false,4,
                              init()::Eval_struct_array_dynamic_index::eval(deqp::gls::
                              ShaderEvalContext__,
                              init()::SetUniforms_struct_array_dynamic_index::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_13a0);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_1540,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_1540,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\tmediump float r = (s[0].b[1].b[0].x + s[1].b[2].b[1].y) * s[0].b[0].a; // (z + z) * 0.5"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\tmediump float g = s[1].b[0].b[0].y * s[0].b[2].a * s[1].b[2].a; // x * 0.25 * 4"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\tmediump float b = (s[0].b[2].b[1].y + s[0].b[1].b[0].y + s[1].a) * s[0].b[1].a; // (w + w + w) * 0.333"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\tmediump float a = float(s[0].c) + s[1].b[2].a - s[1].b[1].a; // 0 + 4.0 - 3.0"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(r, g, b, a);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"nested_struct_array_vertex","Nested struct array",true,0,
                              init()::Eval_nested_struct_array::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_nested_struct_array::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_1540);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_16e0,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_16e0,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\tmediump float r = (s[0].b[1].b[0].x + s[1].b[2].b[1].y) * s[0].b[0].a; // (z + z) * 0.5"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\tmediump float g = s[1].b[0].b[0].y * s[0].b[2].a * s[1].b[2].a; // x * 0.25 * 4"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\tmediump float b = (s[0].b[2].b[1].y + s[0].b[1].b[0].y + s[1].a) * s[0].b[1].a; // (w + w + w) * 0.333"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\tmediump float a = float(s[0].c) + s[1].b[2].a - s[1].b[1].a; // 0 + 4.0 - 3.0"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(r, g, b, a);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"nested_struct_array_fragment","Nested struct array",false,0,
                              init()::Eval_nested_struct_array::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_nested_struct_array::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_16e0);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_1880,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_1880,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\tmediump float r = (s[0].b[ui_one].b[ui_one-1].x + s[ui_one].b[ui_two].b[ui_zero+1].y) * s[0].b[0].a; // (z + z) * 0.5"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\tmediump float g = s[ui_two-1].b[ui_two-2].b[ui_zero].y * s[0].b[ui_two].a * s[ui_one].b[2].a; // x * 0.25 * 4"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\tmediump float b = (s[ui_zero].b[ui_one+1].b[1].y + s[0].b[ui_one*ui_one].b[0].y + s[ui_one].a) * s[0].b[ui_two-ui_one].a; // (w + w + w) * 0.333"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\tmediump float a = float(s[ui_zero].c) + s[ui_one-ui_zero].b[ui_two].a - s[ui_zero+ui_one].b[ui_two-ui_one].a; // 0 + 4.0 - 3.0"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(r, g, b, a);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"nested_struct_array_dynamic_index_vertex",
                              "Nested struct array with dynamic indexing",true,4,
                              init()::Eval_nested_struct_array_dynamic_index::eval(deqp::gls::
                              ShaderEvalContext__,
                              init()::SetUniforms_nested_struct_array_dynamic_index::setUniforms(glw
                              ::Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_1880);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_1a20,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_1a20,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\tmediump float r = (s[0].b[ui_one].b[ui_one-1].x + s[ui_one].b[ui_two].b[ui_zero+1].y) * s[0].b[0].a; // (z + z) * 0.5"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\tmediump float g = s[ui_two-1].b[ui_two-2].b[ui_zero].y * s[0].b[ui_two].a * s[ui_one].b[2].a; // x * 0.25 * 4"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\tmediump float b = (s[ui_zero].b[ui_one+1].b[1].y + s[0].b[ui_one*ui_one].b[0].y + s[ui_one].a) * s[0].b[ui_two-ui_one].a; // (w + w + w) * 0.333"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\tmediump float a = float(s[ui_zero].c) + s[ui_one-ui_zero].b[ui_two].a - s[ui_zero+ui_one].b[ui_two-ui_one].a; // 0 + 4.0 - 3.0"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(r, g, b, a);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"nested_struct_array_dynamic_index_fragment",
                              "Nested struct array with dynamic indexing",false,4,
                              init()::Eval_nested_struct_array_dynamic_index::eval(deqp::gls::
                              ShaderEvalContext__,
                              init()::SetUniforms_nested_struct_array_dynamic_index::setUniforms(glw
                              ::Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_1a20);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_1bc0,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_1bc0,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump int\t\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float rgb[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint alpha = 0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < 3; i++)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\trgb[i] = s[2-i].a;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\talpha += s[i].b;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\t${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"loop_struct_array_vertex","Struct array usage in loop",true,0,
                              init()::Eval_loop_struct_array::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_loop_struct_array::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_1bc0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_1d60,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_1d60,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump int\t\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float rgb[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint alpha = 0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < 3; i++)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\trgb[i] = s[2-i].a;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\talpha += s[i].b;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\t${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"loop_struct_array_fragment","Struct array usage in loop",false
                              ,0,init()::Eval_loop_struct_array::eval(deqp::gls::ShaderEvalContext__
                              ,init()::SetUniforms_loop_struct_array::setUniforms(glw::
                               Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_1d60);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_1f00,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_1f00,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_sixth;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\tmediump float r = 0.0; // (x*3 + y*3) / 6.0");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\tmediump float g = 0.0; // (y*3 + z*3) / 6.0");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\tmediump float b = 0.0; // (z*3 + w*3) / 6.0");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float a = 1.0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < 2; i++)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\tfor (int j = 0; j < 3; j++)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tr += s[0].b[j].b[i].y;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tg += s[i].b[j].b[0].x;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tb += s[i].b[j].b[1].x;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\ta *= s[i].b[j].a;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\t${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"loop_nested_struct_array_vertex",
                              "Nested struct array usage in loop",true,0,
                              init()::Eval_loop_nested_struct_array::eval(deqp::gls::
                              ShaderEvalContext__,
                              init()::SetUniforms_loop_nested_struct_array::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_1f00);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_20a0,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_20a0,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_sixth;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\tmediump float r = 0.0; // (x*3 + y*3) / 6.0");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\tmediump float g = 0.0; // (y*3 + z*3) / 6.0");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\tmediump float b = 0.0; // (z*3 + w*3) / 6.0");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float a = 1.0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < 2; i++)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\tfor (int j = 0; j < 3; j++)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tr += s[0].b[j].b[i].y;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tg += s[i].b[j].b[0].x;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tb += s[i].b[j].b[1].x;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\ta *= s[i].b[j].a;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\t${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"loop_nested_struct_array_fragment",
                              "Nested struct array usage in loop",false,0,
                              init()::Eval_loop_nested_struct_array::eval(deqp::gls::
                              ShaderEvalContext__,
                              init()::SetUniforms_loop_nested_struct_array::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_20a0);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_2240,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_2240,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_three;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump int\t\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float rgb[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint alpha = 0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < ui_three; i++)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\trgb[i] = s[2-i].a;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\talpha += s[i].b;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\t${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"dynamic_loop_struct_array_vertex",
                              "Struct array usage in dynamic loop",true,6,
                              init()::Eval_dynamic_loop_struct_array::eval(deqp::gls::
                              ShaderEvalContext__,
                              init()::SetUniforms_dynamic_loop_struct_array::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_2240);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_23e0,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_23e0,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_three;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump int\t\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float rgb[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint alpha = 0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < ui_three; i++)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\trgb[i] = s[2-i].a;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\talpha += s[i].b;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\t${DST} = vec4(rgb[0], rgb[1], rgb[2], alpha);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"dynamic_loop_struct_array_fragment",
                              "Struct array usage in dynamic loop",false,6,
                              init()::Eval_dynamic_loop_struct_array::eval(deqp::gls::
                              ShaderEvalContext__,
                              init()::SetUniforms_dynamic_loop_struct_array::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_23e0);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_2580,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_2580,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_three;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_sixth;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\tmediump float r = 0.0; // (x*3 + y*3) / 6.0");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\tmediump float g = 0.0; // (y*3 + z*3) / 6.0");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\tmediump float b = 0.0; // (z*3 + w*3) / 6.0");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float a = 1.0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < ui_two; i++)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\tfor (int j = 0; j < ui_three; j++)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tr += s[0].b[j].b[i].y;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tg += s[i].b[j].b[0].x;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tb += s[i].b[j].b[1].x;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\ta *= s[i].b[j].a;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\t${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"dynamic_loop_nested_struct_array_vertex",
                              "Nested struct array usage in dynamic loop",true,6,
                              init()::Eval_dynamic_loop_nested_struct_array::eval(deqp::gls::
                              ShaderEvalContext__,
                              init()::SetUniforms_dynamic_loop_nested_struct_array::setUniforms(glw
                              ::Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_2580);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_2720,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_2720,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_three;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_three;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_four;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_half;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_third;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_fourth;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_sixth;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb[3];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\tmediump float r = 0.0; // (x*3 + y*3) / 6.0");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\tmediump float g = 0.0; // (y*3 + z*3) / 6.0");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\tmediump float b = 0.0; // (z*3 + w*3) / 6.0");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float a = 1.0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tfor (int i = 0; i < ui_two; i++)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\tfor (int j = 0; j < ui_three; j++)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t{");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tr += s[0].b[j].b[i].y;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tg += s[i].b[j].b[0].x;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\tb += s[i].b[j].b[1].x;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t\ta *= s[i].b[j].a;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t\t}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t}");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\t${DST} = vec4(r*uf_sixth, g*uf_sixth, b*uf_sixth, a);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"dynamic_loop_nested_struct_array_fragment",
                              "Nested struct array usage in dynamic loop",false,6,
                              init()::Eval_dynamic_loop_nested_struct_array::eval(deqp::gls::
                              ShaderEvalContext__,
                              init()::SetUniforms_dynamic_loop_nested_struct_array::setUniforms(glw
                              ::Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_2720);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_28c0,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_28c0,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tsampler2D\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\t${DST} = vec4(texture2D(s.c, ${COORDS}.xy * s.b.xy + s.b.z).rgb, s.a);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"sampler_vertex","Sampler in struct",true,1,
                              init()::Eval_sampler::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_sampler::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_28c0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_2a60,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_2a60,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tsampler2D\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\t${DST} = vec4(texture2D(s.c, ${COORDS}.xy * s.b.xy + s.b.z).rgb, s.a);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"sampler_fragment","Sampler in struct",false,1,
                              init()::Eval_sampler::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_sampler::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_2a60);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_2c00,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_2c00,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tsampler2D\t\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\t${DST} = vec4(texture2D(s.b.a, ${COORDS}.xy * s.b.b + s.a).rgb, s.c);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"sampler_nested_vertex","Sampler in nested struct",true,1,
                              init()::Eval_sampler_nested::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_sampler_nested::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_2c00);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_2da0,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_2da0,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_zero;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct T {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tsampler2D\t\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec2\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tT\t\t\t\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\t${DST} = vec4(texture2D(s.b.a, ${COORDS}.xy * s.b.b + s.a).rgb, s.c);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"sampler_nested_fragment","Sampler in nested struct",false,1,
                              init()::Eval_sampler_nested::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_sampler_nested::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_2da0);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_2f40,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_2f40,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tsampler2D\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\t${DST} = vec4(texture2D(s[1].c, ${COORDS}.xy * s[0].b.xy + s[1].b.z).rgb, s[0].a);"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"sampler_array_vertex","Sampler in struct array",true,1,
                              init()::Eval_sampler_array::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_sampler_array::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_2f40);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_30e0,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_30e0,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tsampler2D\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S s[2];");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,
                        "\t${DST} = vec4(texture2D(s[1].c, ${COORDS}.xy * s[0].b.xy + s[1].b.z).rgb, s[0].a);"
                       );
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"sampler_array_fragment","Sampler in struct array",false,1,
                              init()::Eval_sampler_array::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_sampler_array::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_30e0);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_3280,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_3280,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S a;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S b;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S c;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\tS d = S(uf_one, vec3(0.0, floor(${COORDS}.y+1.0), 2.0), ui_two);")
    ;
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(0.0, 0.0, 0.0, 1.0);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == b) ${DST}.x = 1.0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == c) ${DST}.y = 1.0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == d) ${DST}.z = 1.0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"equal_vertex","Struct equality",true,0,
                              init()::Eval_equal::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_equal::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_3280);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_3420,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_3420,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S a;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S b;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S c;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\tS d = S(uf_one, vec3(0.0, floor(${COORDS}.y+1.0), 2.0), ui_two);")
    ;
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(0.0, 0.0, 0.0, 1.0);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == b) ${DST}.x = 1.0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == c) ${DST}.y = 1.0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a == d) ${DST}.z = 1.0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"equal_fragment","Struct equality",false,0,
                              init()::Eval_equal::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_equal::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_3420);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  do {
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_35c0,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_35c0,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S a;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S b;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S c;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\tS d = S(uf_one, vec3(0.0, floor(${COORDS}.y+1.0), 2.0), ui_two);")
    ;
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(0.0, 0.0, 0.0, 1.0);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != b) ${DST}.x = 1.0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != c) ${DST}.y = 1.0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != d) ${DST}.z = 1.0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"not_equal_vertex","Struct equality",true,0,
                              init()::Eval_not_equal::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_not_equal::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_35c0);
    pCVar1 = (this->super_TestCaseGroup).m_context;
    deqp::gls::LineStream::LineStream(&local_3760,0);
    pLVar3 = deqp::gls::LineStream::operator<<(&local_3760,"${DECLARATIONS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform mediump float uf_one;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform int ui_two;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"struct S {");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump float\ta;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tmediump vec3\tb;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tint\t\t\t\tc;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"};");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S a;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S b;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"uniform S c;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"void main (void)");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"{");
    pLVar3 = deqp::gls::LineStream::operator<<
                       (pLVar3,"\tS d = S(uf_one, vec3(0.0, floor(${COORDS}.y+1.0), 2.0), ui_two);")
    ;
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${DST} = vec4(0.0, 0.0, 0.0, 1.0);");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != b) ${DST}.x = 1.0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != c) ${DST}.y = 1.0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\tif (a != d) ${DST}.z = 1.0;");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"\t${ASSIGN_POS}");
    pLVar3 = deqp::gls::LineStream::operator<<(pLVar3,"}");
    pSVar4 = createStructCase(pCVar1,"not_equal_fragment","Struct equality",false,0,
                              init()::Eval_not_equal::eval(deqp::gls::ShaderEvalContext__,
                              init()::SetUniforms_not_equal::setUniforms(glw::
                              Functions_const&,unsigned_int,tcu::Vector<float,4>_const__,pLVar3);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar4);
    deqp::gls::LineStream::~LineStream(&local_3760);
    dVar2 = ::deGetFalse();
  } while (dVar2 != 0);
  return 0;
}

Assistant:

void UniformStructTests::init (void)
{
	#define UNIFORM_STRUCT_CASE(NAME, DESCRIPTION, FLAGS, SHADER_SRC, SET_UNIFORMS_BODY, EVAL_FUNC_BODY)																\
		do {																																							\
			struct SetUniforms_##NAME {																																	\
				 static void setUniforms (const glw::Functions& gl, deUint32 programID, const tcu::Vec4& constCoords) SET_UNIFORMS_BODY /* NOLINT(SET_UNIFORMS_BODY) */ \
			}